

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O2

int beectl_shell_exec(char **args,uint args_num)

{
  __pid_t _Var1;
  char *__s;
  int status;
  
  status = -1;
  fprintf(_stderr,"%s (non-WINDOWS)\n","beectl_shell_exec");
  _Var1 = fork();
  if (_Var1 == 0) {
    close(0);
    close(1);
    close(2);
    execv(*args,args);
    perror("execv");
    return -1;
  }
  if (_Var1 < 1) {
    __s = "fork";
  }
  else {
    _Var1 = wait(&status);
    if (-1 < _Var1) {
      return status;
    }
    __s = "wait";
  }
  perror(__s);
  _exit(1);
}

Assistant:

int
beectl_shell_exec (const char * const *args,
                   const unsigned args_num)
{
#ifdef WINDOWS
  SECURITY_ATTRIBUTES sa = { 0 };
  STARTUPINFOW si = { 0 };
  PROCESS_INFORMATION pi = { 0 };
  DWORD exit_code = -1;
  DWORD dw_error = 0;
  LPVOID lp_msg_buf = NULL;
  LPVOID lp_display_buf = NULL;
  const char* lpsz_function = __func__;
  bool terminated = false;
  LPWSTR cmd = NULL;
  wchar_t **wargs = NULL;
  char **args_escaped = NULL;

  sa.bInheritHandle = TRUE;
  sa.lpSecurityDescriptor = NULL;

  SecureZeroMemory(&si, sizeof si);
  si.cb = sizeof(si);
  si.dwFlags = STARTF_USESHOWWINDOW;
  si.wShowWindow = SW_SHOWDEFAULT;

  args_escaped = escape_args (args, args_num);
  if (unlikely (args_escaped == NULL))
    {
      perror ("escape_args failed");
      goto _ret;
    }

  wargs = convert_single_byte_to_multibyte_array ((const char * const *)args_escaped, args_num);
  if (unlikely (wargs == NULL))
    {
      perror ("convert_single_byte_to_multibyte_array");
      goto _ret;
    }

  if ((cmd = concat_args ((const wchar_t * const *)wargs, args_num)) == NULL)
    {
      perror ("concat_args");
      goto _ret;
    }

  elog_debugw (L"cmd (after concat_args) = %S\n", cmd);
  /*
     Note, the fist argument of CreateProcessW should not be escaped (no quotes around required),
     but it should be properly quoted within `cmd`, e.g.:
     first arg = "C:\\Program Files\\notepad.exe"
     cmd = "\"C:\\Program Files\\notepad.exe\" arg1 arg2 \"arg with spaces\""
  */
  if (!CreateProcessW (NULL,
                       cmd,
                       NULL, /* Process handle not inheritable */
                       NULL, /* Thread handle not inheritable */
                       FALSE, /* Handle inheritance */
                       /*CREATE_NEW_CONSOLE | CREATE_UNICODE_ENVIRONMENT*/0, /* Creation flags*/
                       NULL, /* Use parent's environment */
                       NULL, /* Use parent's starting directory */
                       &si,
                       &pi))
    {
      dw_error = GetLastError ();

      FormatMessage(
                    FORMAT_MESSAGE_ALLOCATE_BUFFER |
                    FORMAT_MESSAGE_FROM_SYSTEM |
                    FORMAT_MESSAGE_IGNORE_INSERTS,
                    NULL,
                    dw_error,
                    MAKELANGID (LANG_NEUTRAL, SUBLANG_DEFAULT),
                    (LPTSTR) &lp_msg_buf,
                    0,
                    NULL);

      lp_display_buf = (LPVOID)LocalAlloc (LMEM_ZEROINIT,
                                        (lstrlen ((LPCTSTR)lp_msg_buf) + lstrlen ((LPCTSTR)lpsz_function) + 40) * sizeof(TCHAR));
      StringCchPrintf ((LPTSTR) lp_display_buf,
                      LocalSize(lp_display_buf) / sizeof (TCHAR),
                      TEXT ("%s failed with error %d: %s"),
                      lpsz_function, dw_error, lp_msg_buf);
      elog_error ("%s\n", lp_display_buf);

      LocalFree (lp_msg_buf);
      LocalFree (lp_display_buf);
      ExitProcess (dw_error);
      goto _ret;
    }
  elog_debugw (L"Created process for command %S\n", cmd);

  terminated = WaitForSingleObject (pi.hProcess, INFINITE);
  elog_debug ("WaitForSingleObject() returned\n");

  GetExitCodeProcess (pi.hProcess, &exit_code);
  elog_debug ("GetExitCodeProcess() returned %d\n", exit_code);
_ret:
  if (cmd != NULL) free (cmd);
  if (pi.hProcess) CloseHandle (pi.hProcess);
  if (pi.hThread) CloseHandle (pi.hThread);
  if (wargs != NULL) free_argsw (wargs, args_num);
  if (args_escaped != NULL) free_args (args_escaped, args_num);

  return exit_code;
#else /* POSIX */
  pid_t cpid;
  int status = -1;

  elog_debug ("%s (non-WINDOWS)\n", __func__);

  cpid = fork ();

  if (cpid == 0) /* Child */
    {
      close (STDIN_FILENO);
      close (STDOUT_FILENO);
      close (STDERR_FILENO);
      /* XXX somehow close inherited file descriptors
         opened in the parent process? */

      execv (args[0], (char * const*) args);
      perror ("execv"); /* execv returns only in case of an error */
    }
  else if (cpid > 0) /* Parent */
    {
      if ((wait (&status)) < 0)
        {
          perror ("wait");
          _exit (1);
        }
    }
  else
    {
      perror ("fork");
      _exit (1);
    }

  return status;
#endif
}